

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)19>_> *
vkt::shaderexecutor::anon_unknown_0::createEmptyDescriptorSetLayout
          (Move<vk::Handle<(vk::HandleType)19>_> *__return_storage_ptr__,DeviceInterface *vkd,
          VkDevice device)

{
  undefined1 local_40 [8];
  VkDescriptorSetLayoutCreateInfo createInfo;
  VkDevice device_local;
  DeviceInterface *vkd_local;
  
  local_40 = (undefined1  [8])0x20;
  createInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  createInfo._4_4_ = 0;
  createInfo.pNext = (void *)0x0;
  createInfo.flags = 0;
  createInfo.bindingCount = 0;
  createInfo.pBindings = (VkDescriptorSetLayoutBinding *)device;
  ::vk::createDescriptorSetLayout
            (__return_storage_ptr__,vkd,device,(VkDescriptorSetLayoutCreateInfo *)local_40,
             (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

static Move<VkDescriptorSetLayout> createEmptyDescriptorSetLayout (const DeviceInterface& vkd, VkDevice device)
{
	const VkDescriptorSetLayoutCreateInfo	createInfo	=
	{
		VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO,
		DE_NULL,
		(VkDescriptorSetLayoutCreateFlags)0,
		0u,
		DE_NULL,
	};
	return createDescriptorSetLayout(vkd, device, &createInfo);
}